

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::OnRehash(Server *this)

{
  unsigned_short uVar1;
  bool bVar2;
  undefined8 uVar3;
  EVP_PKEY_CTX *ctx;
  __sv_type _Var4;
  size_t local_98;
  char *local_90;
  int oldSteamFormat;
  unsigned_short oldPort;
  string oldPass;
  undefined1 local_50 [8];
  string oldClientHostname;
  string oldHostname;
  Server *this_local;
  
  std::__cxx11::string::string
            ((string *)(oldClientHostname.field_2._M_local_buf + 8),&this->m_hostname);
  std::__cxx11::string::string((string *)local_50,&this->m_clientHostname);
  std::__cxx11::string::string((string *)&oldSteamFormat,&this->m_pass);
  uVar1 = this->m_port;
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::clear(&this->m_commands);
  getCore();
  uVar3 = Jupiter::Plugin::getConfig();
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_configSection)
  ;
  local_98 = _Var4._M_len;
  local_90 = _Var4._M_str;
  ctx = (EVP_PKEY_CTX *)Jupiter::Config::getSection(uVar3,local_98,local_90);
  init(this,ctx);
  if ((this->m_port == 0) ||
     (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&this->m_hostname), !bVar2)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_hostname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&oldClientHostname.field_2 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_clientHostname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_pass,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldSteamFormat)
    ;
    this->m_port = uVar1;
  }
  else {
    bVar2 = jessilib::equalsi<char,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&oldClientHostname.field_2 + 8),&this->m_hostname);
    if ((!bVar2) ||
       (((uVar1 != this->m_port ||
         (bVar2 = jessilib::equalsi<char,char>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50,&this->m_clientHostname), !bVar2)) ||
        (bVar2 = jessilib::equalsi<char,char>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oldSteamFormat,&this->m_pass), !bVar2)))) {
      reconnect(this,Rehash);
    }
  }
  std::__cxx11::string::~string((string *)&oldSteamFormat);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(oldClientHostname.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int RenX::Server::OnRehash() {
	std::string oldHostname = m_hostname;
	std::string oldClientHostname = m_clientHostname;
	std::string oldPass = m_pass;
	unsigned short oldPort = m_port;
	int oldSteamFormat = m_steamFormat;
	m_commands.clear();
	init(*RenX::getCore()->getConfig().getSection(m_configSection));
	if (m_port == 0 || !m_hostname.empty()) {
		m_hostname = oldHostname;
		m_clientHostname = oldClientHostname;
		m_pass = oldPass;
		m_port = oldPort;
	}
	else if (!jessilib::equalsi(oldHostname, m_hostname)
		|| oldPort != m_port
		|| !jessilib::equalsi(oldClientHostname, m_clientHostname)
		|| !jessilib::equalsi(oldPass, m_pass)) {
		reconnect(RenX::DisconnectReason::Rehash);
	}

	return 0;
}